

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O2

QPoint QHighDpi::fromNativeLocalPosition<QPoint,QWindow>(QPoint *value,QWindow *context)

{
  QPoint QVar1;
  qreal qVar2;
  
  qVar2 = QHighDpiScaling::factor<QWindow_const>(context);
  QVar1 = scale(value,1.0 / qVar2,(QPoint)0x0);
  return QVar1;
}

Assistant:

T fromNativeLocalPosition(const T &value, const C *context)
{
    return scale(value, qreal(1) / QHighDpiScaling::factor(context));
}